

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong
helper_precrq_rs_qh_pw_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((long)rs < 0x7fff800000000000) {
    uVar5 = rs + 0x800000000000 & 0xffff000000000000;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar5 = 0x7fff000000000000;
  }
  if ((int)rs < 0x7fff8000) {
    uVar2 = rs * 0x10000 + 0x80000000 & 0xffff00000000;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = 0x7fff00000000;
  }
  if ((long)rt < 0x7fff800000000000) {
    uVar3 = (ulong)((int)(rt >> 0x20) + 0x8000U & 0xffff0000);
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar3 = 0x7fff0000;
  }
  if ((int)rt < 0x7fff8000) {
    uVar4 = (ulong)((int)rt + 0x8000U >> 0x10);
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar4 = 0x7fff;
  }
  return uVar2 | uVar5 | uVar3 | uVar4;
}

Assistant:

target_ulong helper_precrq_rs_qh_pw(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    uint32_t rs2, rs0;
    uint32_t rt2, rt0;
    uint16_t tempD, tempC, tempB, tempA;

    rs2 = (rs >> 32) & MIPSDSP_LLO;
    rs0 = rs & MIPSDSP_LLO;
    rt2 = (rt >> 32) & MIPSDSP_LLO;
    rt0 = rt & MIPSDSP_LLO;

    tempD = mipsdsp_trunc16_sat16_round(rs2, env);
    tempC = mipsdsp_trunc16_sat16_round(rs0, env);
    tempB = mipsdsp_trunc16_sat16_round(rt2, env);
    tempA = mipsdsp_trunc16_sat16_round(rt0, env);

    return MIPSDSP_RETURN64_16(tempD, tempC, tempB, tempA);
}